

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyUtils.cpp
# Opt level: O2

bool isOperator(string *str)

{
  bool bVar1;
  
  bVar1 = std::operator==(str,"+");
  if (!bVar1) {
    bVar1 = std::operator==(str,"-");
    if (!bVar1) {
      bVar1 = std::operator==(str,"*");
      if (!bVar1) {
        bVar1 = std::operator==(str,"/");
        if (!bVar1) {
          bVar1 = std::operator==(str,"<");
          if (!bVar1) {
            bVar1 = std::operator==(str,">");
            if (!bVar1) {
              bVar1 = std::operator==(str,"==");
              if (!bVar1) {
                bVar1 = std::operator==(str,"=");
                return bVar1;
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool isOperator(string str)
{
    return str == "+" || str == "-" || str == "*" || str == "/" ||
            str == "<" || str == ">" || str == "==" || str == "=";

}